

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec2d.cpp
# Opt level: O3

Vec2d * __thiscall Vec2d::getRotation(Vec2d *this,Vec2d *rotationPoint,float angle)

{
  float fVar1;
  Vec2d *pVVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar3 = sinf(angle);
  fVar4 = roundf(fVar3);
  fVar3 = cosf(angle);
  fVar5 = roundf(fVar3);
  fVar3 = rotationPoint->x;
  fVar1 = rotationPoint->y;
  fVar6 = this->x - fVar3;
  fVar7 = this->y - fVar1;
  pVVar2 = (Vec2d *)operator_new(8);
  pVVar2->x = (fVar6 * fVar5 - fVar4 * fVar7) + fVar3;
  pVVar2->y = fVar7 * fVar5 + fVar4 * fVar6 + fVar1;
  return pVVar2;
}

Assistant:

Vec2d* Vec2d::getRotation(Vec2d* rotationPoint, float angle) {
    float s = round(sin(angle));
    float c = round(cos(angle));
    
    // translate point back to origin:
    float rotationX = x - rotationPoint->getX();
    float rotationY = y - rotationPoint->getY();
    
    float xnew = rotationX * c - rotationY * s;
    float ynew = rotationY * c + rotationX * s;
    
    // translate point back:
    return new Vec2d(xnew + rotationPoint->getX(), ynew + rotationPoint->getY());
}